

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int a;
  int b;
  int iVar1;
  float *pfVar2;
  uchar *__ptr;
  int *piVar3;
  long lVar4;
  float *pfVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  stbi__result_info *in_R9;
  uchar *puVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    piVar3 = comp;
    iVar1 = req_comp;
    __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      stbi__g_failure_reason = "Image not of any known type, or corrupt";
    }
    else {
      a = *x;
      b = *y;
      if (req_comp == 0) {
        req_comp = *comp;
      }
      pfVar2 = (float *)stbi__malloc_mad4(a,b,req_comp,(int)piVar3,iVar1);
      if (pfVar2 != (float *)0x0) {
        uVar10 = (req_comp + (req_comp & 1U)) - 1;
        uVar6 = b * a;
        uVar12 = 0;
        uVar11 = (ulong)uVar10;
        if ((int)uVar10 < 1) {
          uVar11 = uVar12;
        }
        lVar4 = (long)req_comp;
        pfVar5 = pfVar2;
        puVar9 = __ptr;
        uVar7 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar7 = uVar12;
        }
        for (; uVar12 != uVar7; uVar12 = uVar12 + 1) {
          for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
            fVar14 = powf((float)puVar9[uVar13] / 255.0,stbi__l2h_gamma);
            pfVar5[uVar13] = fVar14 * stbi__l2h_scale;
          }
          if ((int)uVar11 < req_comp) {
            lVar8 = uVar12 * lVar4 + uVar11;
            pfVar2[lVar8] = (float)__ptr[lVar8] / 255.0;
          }
          pfVar5 = pfVar5 + lVar4;
          puVar9 = puVar9 + lVar4;
        }
        free(__ptr);
        return pfVar2;
      }
      free(__ptr);
      stbi__g_failure_reason = "Out of memory";
    }
    pfVar2 = (float *)0x0;
  }
  else {
    pfVar2 = stbi__hdr_load(s,x,y,comp,req_comp,in_R9);
    if ((pfVar2 != (float *)0x0) && (stbi__vertically_flip_on_load != 0)) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(pfVar2,*x,*y,req_comp << 2);
    }
  }
  return pfVar2;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}